

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O3

void __thiscall aalcalc::debug(aalcalc *this,string *subfolder)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  undefined8 extraout_RAX;
  string s;
  string path;
  string local_98;
  undefined1 local_78 [32];
  _Base_ptr local_58;
  aalcalc *local_38;
  
  local_38 = this;
  loadoccurrence(this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 "work/",subfolder);
  std::__cxx11::string::substr((ulong)&local_98,(ulong)local_78);
  iVar2 = std::__cxx11::string::compare((char *)&local_98);
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (iVar2 != 0) {
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_78._0_8_,(char *)(local_78._0_8_ + local_78._8_8_));
    std::__cxx11::string::append((char *)&local_98);
    std::__cxx11::string::operator=((string *)local_78,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  __dirp = opendir((char *)local_78._0_8_);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar3 = readdir(__dirp);
      if (pdVar3 == (dirent *)0x0) break;
      local_98._M_dataplus._M_p = (pointer)paVar1;
      sVar4 = strlen(pdVar3->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,pdVar3->d_name,pdVar3->d_name + sVar4);
      if (4 < local_98._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_58,(ulong)&local_98);
        iVar2 = std::__cxx11::string::compare((char *)&local_58);
        if (local_58 != (_Base_ptr)&stack0xffffffffffffffb8) {
          operator_delete(local_58);
        }
        if (iVar2 == 0) {
          local_58 = (_Base_ptr)&stack0xffffffffffffffb8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,local_78._0_8_,(char *)(local_78._0_8_ + local_78._8_8_));
          std::__cxx11::string::append((char *)&local_58);
          std::__cxx11::string::operator=((string *)&local_98,(string *)&local_58);
          if (local_58 != (_Base_ptr)&stack0xffffffffffffffb8) {
            operator_delete(local_58);
          }
          debug_process_summaryfile(local_38,&local_98);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_);
    }
    return;
  }
  debug((aalcalc *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void aalcalc::debug(const std::string &subfolder)
{
	loadoccurrence();
	std::string path = "work/" + subfolder;
	if (path.substr(path.length() - 1, 1) != "/") {
		path = path + "/";
	}

	DIR *dir;
	struct dirent *ent;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				s = path + ent->d_name;
				debug_process_summaryfile(s);
			}
		}
	}
	else {
		fprintf(stderr, "FATAL: Unable to open directory %s\n", path.c_str());
		exit(-1);
	}
}